

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# priority_list.cpp
# Opt level: O1

Am_Priority_List * __thiscall
Am_Priority_List::Add
          (Am_Priority_List *this,Am_Object *obj,float main_priority,int second_priority,
          int third_priority)

{
  Am_Priority_List_Item *item;
  
  item = (Am_Priority_List_Item *)operator_new(0x28);
  (item->obj).data = (Am_Object_Data *)0x0;
  Am_Object::operator=((Am_Object *)item,obj);
  item->main_priority = main_priority;
  item->second_priority = second_priority;
  item->third_priority = third_priority;
  insert_item_at_right_place(this,item);
  this->number = this->number + 1;
  return this;
}

Assistant:

Am_Priority_List *
Am_Priority_List::Add(Am_Object obj, float main_priority, int second_priority,
                      int third_priority)
{
  Am_Priority_List_Item *item = new Am_Priority_List_Item;
  item->obj = obj;
  item->main_priority = main_priority;
  item->second_priority = second_priority;
  item->third_priority = third_priority;
  this->insert_item_at_right_place(item);
  number++;
  return this;
}